

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O0

int __thiscall
zmq::router_t::xsetsockopt(router_t *this,int option_,void *optval_,size_t optvallen_)

{
  int iVar1;
  int *piVar2;
  routing_socket_base_t *in_RCX;
  int *in_RDX;
  int in_ESI;
  void *in_RDI;
  bool bVar3;
  int value;
  bool is_int;
  undefined4 in_stack_ffffffffffffffc0;
  int local_30;
  undefined3 in_stack_ffffffffffffffd4;
  
  bVar3 = in_RCX == (routing_socket_base_t *)0x4;
  local_30 = 0;
  if (bVar3) {
    local_30 = *in_RDX;
  }
  if (in_ESI == 0x21) {
    if ((bVar3) && (-1 < local_30)) {
      *(bool *)((long)in_RDI + 0x848) = local_30 != 0;
      return 0;
    }
  }
  else if (in_ESI == 0x29) {
    if ((bVar3) && (-1 < local_30)) {
      *(bool *)((long)in_RDI + 0x849) = local_30 != 0;
      if ((*(byte *)((long)in_RDI + 0x849) & 1) != 0) {
        *(undefined1 *)((long)in_RDI + 0x18a) = 0;
        *(undefined1 *)((long)in_RDI + 0x18b) = 1;
      }
      return 0;
    }
  }
  else if (in_ESI == 0x33) {
    if ((bVar3) && (-1 < local_30)) {
      *(bool *)((long)in_RDI + 0x84a) = local_30 != 0;
      return 0;
    }
  }
  else if (in_ESI == 0x38) {
    if ((bVar3) && (-1 < local_30)) {
      *(bool *)((long)in_RDI + 0x84b) = local_30 != 0;
      return 0;
    }
  }
  else {
    if (in_ESI != 0x61) {
      iVar1 = routing_socket_base_t::xsetsockopt
                        (in_RCX,CONCAT13(bVar3,in_stack_ffffffffffffffd4),in_RDI,
                         CONCAT44(in_ESI,in_stack_ffffffffffffffc0));
      return iVar1;
    }
    if (((bVar3) && (-1 < local_30)) && (local_30 < 4)) {
      *(int *)((long)in_RDI + 0x408) = local_30;
      return 0;
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 0x16;
  return -1;
}

Assistant:

int zmq::router_t::xsetsockopt (int option_,
                                const void *optval_,
                                size_t optvallen_)
{
    const bool is_int = (optvallen_ == sizeof (int));
    int value = 0;
    if (is_int)
        memcpy (&value, optval_, sizeof (int));

    switch (option_) {
        case ZMQ_ROUTER_RAW:
            if (is_int && value >= 0) {
                _raw_socket = (value != 0);
                if (_raw_socket) {
                    options.recv_routing_id = false;
                    options.raw_socket = true;
                }
                return 0;
            }
            break;

        case ZMQ_ROUTER_MANDATORY:
            if (is_int && value >= 0) {
                _mandatory = (value != 0);
                return 0;
            }
            break;

        case ZMQ_PROBE_ROUTER:
            if (is_int && value >= 0) {
                _probe_router = (value != 0);
                return 0;
            }
            break;

        case ZMQ_ROUTER_HANDOVER:
            if (is_int && value >= 0) {
                _handover = (value != 0);
                return 0;
            }
            break;

#ifdef ZMQ_BUILD_DRAFT_API
        case ZMQ_ROUTER_NOTIFY:
            if (is_int && value >= 0
                && value <= (ZMQ_NOTIFY_CONNECT | ZMQ_NOTIFY_DISCONNECT)) {
                options.router_notify = value;
                return 0;
            }
            break;
#endif

        default:
            return routing_socket_base_t::xsetsockopt (option_, optval_,
                                                       optvallen_);
    }
    errno = EINVAL;
    return -1;
}